

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::train(FastText *this,shared_ptr<fasttext::Args> *args)

{
  bool bVar1;
  byte bVar2;
  int32_t iVar3;
  element_type *peVar4;
  ostream *poVar5;
  long lVar6;
  element_type *peVar7;
  element_type *this_00;
  clock_t cVar8;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  long in_RDI;
  iterator it;
  int32_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  ifstream ifs;
  FastText *in_stack_00000870;
  undefined4 in_stack_fffffffffffffc88;
  undefined4 in_stack_fffffffffffffc8c;
  int iVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffc9c;
  __atomic_base<long> *in_stack_fffffffffffffca0;
  real in_stack_fffffffffffffcac;
  Matrix *in_stack_fffffffffffffcb0;
  type *in_stack_fffffffffffffcb8;
  element_type *in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  int32_t in_stack_fffffffffffffccc;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
  local_2e0 [2];
  int local_2d0;
  int local_2bc;
  int32_t local_29c;
  int32_t local_284;
  istream *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  undefined1 local_268 [64];
  undefined1 local_228 [512];
  string *in_stack_ffffffffffffffd8;
  FastText *in_stack_ffffffffffffffe0;
  
  std::shared_ptr<fasttext::Args>::operator=
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffc90,
             (shared_ptr<fasttext::Args> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::make_shared<fasttext::Dictionary,std::shared_ptr<fasttext::Args>&>
            ((shared_ptr<fasttext::Args> *)in_stack_fffffffffffffcb8);
  std::shared_ptr<fasttext::Dictionary>::operator=
            ((shared_ptr<fasttext::Dictionary> *)in_stack_fffffffffffffc90,
             (shared_ptr<fasttext::Dictionary> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  std::shared_ptr<fasttext::Dictionary>::~shared_ptr((shared_ptr<fasttext::Dictionary> *)0x1560de);
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1560e8);
  bVar1 = std::operator==(in_stack_fffffffffffffc90,
                          (char *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
  if (bVar1) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Cannot use stdin for training!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x156133);
  std::ifstream::ifstream(local_228,(string *)peVar4,_S_in);
  bVar2 = std::ifstream::is_open();
  if ((bVar2 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"Input file cannot be opened!");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1561c5);
  Dictionary::readFromFile
            ((Dictionary *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
             in_stack_fffffffffffffd88);
  std::ifstream::close();
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x1561f0);
  lVar6 = std::__cxx11::string::size();
  if (lVar6 == 0) {
    peVar7 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1562d8);
    in_stack_fffffffffffffccc = Dictionary::nwords(peVar7);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1562f0);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x156310);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
    in_stack_fffffffffffffcb8 = (type *)(in_RDI + 0x20);
    in_stack_fffffffffffffcb0 = (Matrix *)local_268;
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffc90,
               (shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x15635b);
    in_stack_fffffffffffffcc0 =
         std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     *)0x156365);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x156374);
    Matrix::uniform(in_stack_fffffffffffffcb0,in_stack_fffffffffffffcac);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"loading pre-trained subwords from: ");
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15622d);
    poVar5 = std::operator<<(poVar5,(string *)&peVar4->pretrainedVectors);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x156265);
    std::__cxx11::string::string((string *)(local_268 + 0x10),(string *)&peVar4->pretrainedVectors);
    loadVectors(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    std::__cxx11::string::~string((string *)(local_268 + 0x10));
  }
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1563a4);
  if (peVar4->model == sup) {
    peVar7 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1563bb);
    local_284 = Dictionary::nlabels(peVar7);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1563de);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffc90,
               (shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x156422);
  }
  else {
    peVar7 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x156432);
    local_29c = Dictionary::nwords(peVar7);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x156455);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)in_stack_fffffffffffffcb8,(int *)in_stack_fffffffffffffcb0);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffc90,
               (shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x156499);
  }
  this_00 = std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1564a7);
  Matrix::zero(this_00);
  cVar8 = clock();
  *(clock_t *)(in_RDI + 0x58) = cVar8;
  std::__atomic_base<long>::operator=
            (in_stack_fffffffffffffca0,CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)
            );
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1564d9);
  poVar5 = std::operator<<((ostream *)&std::cout,"Created threads: ");
  peVar7 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x156501);
  iVar3 = Dictionary::nwords(peVar7);
  this_01 = (vector<std::thread,_std::allocator<std::thread>_> *)
            std::ostream::operator<<(poVar5,iVar3);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  local_2bc = 0;
  while( true ) {
    iVar9 = local_2bc;
    peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x156557);
    if (peVar4->thread <= iVar9) break;
    local_2d0 = local_2bc;
    std::thread::thread<fasttext::FastText::train(std::shared_ptr<fasttext::Args>)::__0,,void>
              ((thread *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              (this_01,(value_type *)CONCAT44(iVar9,in_stack_fffffffffffffc88));
    std::thread::~thread((thread *)0x1565c0);
    local_2bc = local_2bc + 1;
  }
  local_2e0[0]._M_current =
       (thread *)
       std::vector<std::thread,_std::allocator<std::thread>_>::begin
                 ((vector<std::thread,_std::allocator<std::thread>_> *)
                  CONCAT44(iVar9,in_stack_fffffffffffffc88));
  while( true ) {
    std::vector<std::thread,_std::allocator<std::thread>_>::end
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT44(iVar9,in_stack_fffffffffffffc88));
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)this_01,
                       (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                        *)CONCAT44(iVar9,in_stack_fffffffffffffc88));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator->(local_2e0);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(local_2e0);
  }
  std::
  make_shared<fasttext::Model,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Args>&,int>
            ((shared_ptr<fasttext::Matrix> *)
             CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             (shared_ptr<fasttext::Matrix> *)in_stack_fffffffffffffcc0,
             (shared_ptr<fasttext::Args> *)in_stack_fffffffffffffcb8,
             (int *)in_stack_fffffffffffffcb0);
  std::shared_ptr<fasttext::Model>::operator=
            ((shared_ptr<fasttext::Model> *)this_01,
             (shared_ptr<fasttext::Model> *)CONCAT44(iVar9,in_stack_fffffffffffffc88));
  std::shared_ptr<fasttext::Model>::~shared_ptr((shared_ptr<fasttext::Model> *)0x1566d4);
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1566de);
  if (peVar4->model != sup) {
    saveVectors(in_stack_00000870);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)poVar5);
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

void FastText::train(std::shared_ptr<Args> args) {
  args_ = args;
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    std::cerr << "Cannot use stdin for training!" << std::endl;
    exit(EXIT_FAILURE);
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    std::cerr << "Input file cannot be opened!" << std::endl;
    exit(EXIT_FAILURE);
  }
  dict_->readFromFile(ifs);
  ifs.close();

  if (args_->pretrainedVectors.size() != 0) {
    std::cout << "loading pre-trained subwords from: " << args_->pretrainedVectors << std::endl;
    loadVectors(args_->pretrainedVectors);
  } else {
    input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
    input_->uniform(1.0 / args_->dim);
  }

  if (args_->model == model_name::sup) {
    output_ = std::make_shared<Matrix>(dict_->nlabels(), args_->dim);
  } else {
    output_ = std::make_shared<Matrix>(dict_->nwords(), args_->dim);
  }
  output_->zero();

//  reduceCorpus(0);
//  exit(-1);

  start = clock();
  tokenCount = 0;
  std::vector<std::thread> threads;
  std::cout <<  "Created threads: " << dict_->nwords() << std::endl;
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  for (auto it = threads.begin(); it != threads.end(); ++it) {
    it->join();
  }
  model_ = std::make_shared<Model>(input_, output_, args_, 0);

  //saveModel();
  if (args_->model != model_name::sup) {
    saveVectors();
  }
}